

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disflow_sse4.c
# Opt level: O3

void aom_compute_flow_at_point_sse4_1
               (uint8_t *src,uint8_t *ref,int x,int y,int width,int height,int stride,double *u,
               double *v)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  ulong uVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  undefined1 (*pauVar10) [16];
  int iVar11;
  uint8_t *puVar12;
  short sVar13;
  short sVar22;
  short sVar23;
  short sVar24;
  short sVar25;
  short sVar27;
  short sVar28;
  undefined1 auVar14 [16];
  short sVar29;
  double dVar26;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar21 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar30 [16];
  short sVar31;
  short sVar36;
  double dVar32;
  short sVar34;
  short sVar35;
  short sVar37;
  short sVar38;
  short sVar39;
  undefined1 auVar33 [16];
  short sVar40;
  undefined4 uVar41;
  undefined4 uVar48;
  undefined4 uVar49;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined4 uVar50;
  undefined1 auVar47 [16];
  double dVar51;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  double dVar59;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  double dVar60;
  undefined1 auVar62 [16];
  double dVar61;
  double dVar66;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  short sVar67;
  short sVar69;
  short sVar70;
  short sVar71;
  short sVar72;
  short sVar73;
  short sVar74;
  short sVar75;
  undefined1 auVar68 [16];
  undefined1 in_XMM9 [16];
  undefined1 in_XMM10 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  double dVar79;
  double dVar83;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  int16_t dy [64];
  int16_t dx [64];
  undefined1 auStack_1e8 [16];
  undefined2 auStack_1d8 [8];
  undefined1 auStack_1c8 [16];
  undefined2 auStack_1b8 [64];
  short asStack_138 [64];
  short asStack_b8 [68];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar46 [16];
  undefined1 auVar56 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  
  auVar3 = _DAT_00d13850;
  auVar2 = _DAT_00d12fd0;
  uVar4 = (ulong)stride;
  lVar6 = (long)(stride * y + x);
  auVar33 = *(undefined1 (*) [16])(src + ~uVar4 + lVar6);
  auVar30 = pmovzxbw(in_XMM1,auVar33);
  auVar14 = pmovzxbw(auVar33 >> 8,auVar33 >> 8);
  auVar33 = pmovzxbw(auVar33 >> 0x10,auVar33 >> 0x10);
  auVar53._0_2_ = auVar30._0_2_ + auVar33._0_2_;
  auVar53._2_2_ = auVar30._2_2_ + auVar33._2_2_;
  auVar53._4_2_ = auVar30._4_2_ + auVar33._4_2_;
  auVar53._6_2_ = auVar30._6_2_ + auVar33._6_2_;
  auVar53._8_2_ = auVar30._8_2_ + auVar33._8_2_;
  auVar53._10_2_ = auVar30._10_2_ + auVar33._10_2_;
  auVar53._12_2_ = auVar30._12_2_ + auVar33._12_2_;
  auVar53._14_2_ = auVar30._14_2_ + auVar33._14_2_;
  auVar43._0_2_ = auVar30._0_2_ - auVar33._0_2_;
  auVar43._2_2_ = auVar30._2_2_ - auVar33._2_2_;
  auVar43._4_2_ = auVar30._4_2_ - auVar33._4_2_;
  auVar43._6_2_ = auVar30._6_2_ - auVar33._6_2_;
  auVar43._8_2_ = auVar30._8_2_ - auVar33._8_2_;
  auVar43._10_2_ = auVar30._10_2_ - auVar33._10_2_;
  auVar43._12_2_ = auVar30._12_2_ - auVar33._12_2_;
  auVar43._14_2_ = auVar30._14_2_ - auVar33._14_2_;
  auVar33 = *(undefined1 (*) [16])(src + lVar6 + -1);
  auVar42 = pmovzxbw(auVar53,auVar33);
  auVar30 = pmovzxbw(auVar33 >> 8,auVar33 >> 8);
  auVar52 = pmovzxbw(auVar33 >> 0x10,auVar33 >> 0x10);
  auVar33._0_2_ = auVar42._0_2_ - auVar52._0_2_;
  auVar33._2_2_ = auVar42._2_2_ - auVar52._2_2_;
  auVar33._4_2_ = auVar42._4_2_ - auVar52._4_2_;
  auVar33._6_2_ = auVar42._6_2_ - auVar52._6_2_;
  auVar33._8_2_ = auVar42._8_2_ - auVar52._8_2_;
  auVar33._10_2_ = auVar42._10_2_ - auVar52._10_2_;
  auVar33._12_2_ = auVar42._12_2_ - auVar52._12_2_;
  auVar33._14_2_ = auVar42._14_2_ - auVar52._14_2_;
  pauVar10 = (undefined1 (*) [16])(src + (long)(stride * y) + uVar4 + (long)x + -1);
  lVar6 = 0;
  sVar13 = auVar14._0_2_ * 2 + auVar53._0_2_;
  sVar22 = auVar14._2_2_ * 2 + auVar53._2_2_;
  sVar23 = auVar14._4_2_ * 2 + auVar53._4_2_;
  sVar24 = auVar14._6_2_ * 2 + auVar53._6_2_;
  sVar25 = auVar14._8_2_ * 2 + auVar53._8_2_;
  sVar27 = auVar14._10_2_ * 2 + auVar53._10_2_;
  sVar28 = auVar14._12_2_ * 2 + auVar53._12_2_;
  sVar29 = auVar14._14_2_ * 2 + auVar53._14_2_;
  sVar31 = auVar30._0_2_ * 2 + auVar42._0_2_ + auVar52._0_2_;
  sVar34 = auVar30._2_2_ * 2 + auVar42._2_2_ + auVar52._2_2_;
  sVar35 = auVar30._4_2_ * 2 + auVar42._4_2_ + auVar52._4_2_;
  sVar36 = auVar30._6_2_ * 2 + auVar42._6_2_ + auVar52._6_2_;
  sVar37 = auVar30._8_2_ * 2 + auVar42._8_2_ + auVar52._8_2_;
  sVar38 = auVar30._10_2_ * 2 + auVar42._10_2_ + auVar52._10_2_;
  sVar39 = auVar30._12_2_ * 2 + auVar42._12_2_ + auVar52._12_2_;
  sVar40 = auVar30._14_2_ * 2 + auVar42._14_2_ + auVar52._14_2_;
  do {
    auVar14 = *pauVar10;
    auVar30 = pmovzxbw(auVar33,auVar14);
    auVar42 = pmovzxbw(auVar14 >> 8,auVar14 >> 8);
    auVar53 = pmovzxbw(auVar14 >> 0x10,auVar14 >> 0x10);
    sVar67 = auVar42._0_2_ * 2 + auVar30._0_2_ + auVar53._0_2_;
    sVar69 = auVar42._2_2_ * 2 + auVar30._2_2_ + auVar53._2_2_;
    sVar70 = auVar42._4_2_ * 2 + auVar30._4_2_ + auVar53._4_2_;
    sVar71 = auVar42._6_2_ * 2 + auVar30._6_2_ + auVar53._6_2_;
    sVar72 = auVar42._8_2_ * 2 + auVar30._8_2_ + auVar53._8_2_;
    sVar73 = auVar42._10_2_ * 2 + auVar30._10_2_ + auVar53._10_2_;
    sVar74 = auVar42._12_2_ * 2 + auVar30._12_2_ + auVar53._12_2_;
    sVar75 = auVar42._14_2_ * 2 + auVar30._14_2_ + auVar53._14_2_;
    auVar14._0_2_ = auVar30._0_2_ - auVar53._0_2_;
    auVar14._2_2_ = auVar30._2_2_ - auVar53._2_2_;
    auVar14._4_2_ = auVar30._4_2_ - auVar53._4_2_;
    auVar14._6_2_ = auVar30._6_2_ - auVar53._6_2_;
    auVar14._8_2_ = auVar30._8_2_ - auVar53._8_2_;
    auVar14._10_2_ = auVar30._10_2_ - auVar53._10_2_;
    auVar14._12_2_ = auVar30._12_2_ - auVar53._12_2_;
    auVar14._14_2_ = auVar30._14_2_ - auVar53._14_2_;
    *(short *)((long)asStack_b8 + lVar6) = auVar33._0_2_ * 2 + auVar43._0_2_ + auVar14._0_2_;
    *(short *)((long)asStack_b8 + lVar6 + 2) = auVar33._2_2_ * 2 + auVar43._2_2_ + auVar14._2_2_;
    *(short *)((long)asStack_b8 + lVar6 + 4) = auVar33._4_2_ * 2 + auVar43._4_2_ + auVar14._4_2_;
    *(short *)((long)asStack_b8 + lVar6 + 6) = auVar33._6_2_ * 2 + auVar43._6_2_ + auVar14._6_2_;
    *(short *)((long)asStack_b8 + lVar6 + 8) = auVar33._8_2_ * 2 + auVar43._8_2_ + auVar14._8_2_;
    *(short *)((long)asStack_b8 + lVar6 + 10) = auVar33._10_2_ * 2 + auVar43._10_2_ + auVar14._10_2_
    ;
    *(short *)((long)asStack_b8 + lVar6 + 0xc) =
         auVar33._12_2_ * 2 + auVar43._12_2_ + auVar14._12_2_;
    *(short *)((long)asStack_b8 + lVar6 + 0xe) =
         auVar33._14_2_ * 2 + auVar43._14_2_ + auVar14._14_2_;
    *(short *)((long)asStack_138 + lVar6) = sVar13 - sVar67;
    *(short *)((long)asStack_138 + lVar6 + 2) = sVar22 - sVar69;
    *(short *)((long)asStack_138 + lVar6 + 4) = sVar23 - sVar70;
    *(short *)((long)asStack_138 + lVar6 + 6) = sVar24 - sVar71;
    *(short *)((long)asStack_138 + lVar6 + 8) = sVar25 - sVar72;
    *(short *)((long)asStack_138 + lVar6 + 10) = sVar27 - sVar73;
    *(short *)((long)asStack_138 + lVar6 + 0xc) = sVar28 - sVar74;
    *(short *)((long)asStack_138 + lVar6 + 0xe) = sVar29 - sVar75;
    lVar6 = lVar6 + 0x10;
    pauVar10 = (undefined1 (*) [16])(*pauVar10 + uVar4);
    auVar43 = auVar33;
    auVar33 = auVar14;
    sVar13 = sVar31;
    sVar22 = sVar34;
    sVar23 = sVar35;
    sVar24 = sVar36;
    sVar25 = sVar37;
    sVar27 = sVar38;
    sVar28 = sVar39;
    sVar29 = sVar40;
    sVar31 = sVar67;
    sVar34 = sVar69;
    sVar35 = sVar70;
    sVar36 = sVar71;
    sVar37 = sVar72;
    sVar38 = sVar73;
    sVar39 = sVar74;
    sVar40 = sVar75;
  } while (lVar6 != 0x80);
  lVar6 = 0;
  auVar33 = (undefined1  [16])0x0;
  auVar43 = (undefined1  [16])0x0;
  auVar14 = (undefined1  [16])0x0;
  do {
    auVar30 = *(undefined1 (*) [16])((long)asStack_b8 + lVar6);
    auVar53 = *(undefined1 (*) [16])((long)asStack_138 + lVar6);
    auVar52 = pmaddwd(auVar30,auVar30);
    auVar42._0_4_ = auVar43._0_4_ + auVar52._0_4_;
    auVar42._4_4_ = auVar43._4_4_ + auVar52._4_4_;
    auVar42._8_4_ = auVar43._8_4_ + auVar52._8_4_;
    auVar42._12_4_ = auVar43._12_4_ + auVar52._12_4_;
    auVar43 = pmaddwd(auVar30,auVar53);
    auVar52._0_4_ = auVar14._0_4_ + auVar43._0_4_;
    auVar52._4_4_ = auVar14._4_4_ + auVar43._4_4_;
    auVar52._8_4_ = auVar14._8_4_ + auVar43._8_4_;
    auVar52._12_4_ = auVar14._12_4_ + auVar43._12_4_;
    auVar43 = pmaddwd(auVar53,auVar53);
    auVar30._0_4_ = auVar33._0_4_ + auVar43._0_4_;
    auVar30._4_4_ = auVar33._4_4_ + auVar43._4_4_;
    auVar30._8_4_ = auVar33._8_4_ + auVar43._8_4_;
    auVar30._12_4_ = auVar33._12_4_ + auVar43._12_4_;
    lVar6 = lVar6 + 0x10;
    auVar33 = auVar30;
    auVar43 = auVar42;
    auVar14 = auVar52;
  } while (lVar6 != 0x80);
  auVar33 = phaddd(auVar42,auVar52);
  auVar43 = phaddd(auVar52,auVar30);
  auVar33 = phaddd(auVar33,auVar43);
  dVar32 = (double)(auVar33._0_4_ + 1);
  dVar26 = (double)(auVar33._12_4_ + 1);
  dVar60 = 1.0 / (dVar26 * dVar32 - (double)auVar33._8_4_ * (double)auVar33._4_4_);
  dVar66 = *v;
  iVar5 = 0;
  auVar43 = pmovzxbd(in_XMM9,0x80808080);
  auVar14 = pmovsxbw(in_XMM10,0x100010001000100);
  do {
    auVar89._8_8_ = 0;
    auVar89._0_8_ = dVar66;
    dVar1 = *u;
    auVar62._8_8_ = dVar66;
    auVar62._0_8_ = dVar1;
    auVar53 = roundpd(auVar89,auVar62,9);
    dVar61 = dVar1 - auVar53._0_8_;
    dVar66 = dVar66 - auVar53._8_8_;
    dVar79 = dVar61 * dVar61;
    dVar83 = dVar66 * dVar66;
    auVar63._0_8_ = dVar61 * 0.5;
    auVar63._8_8_ = dVar66 * 0.5;
    dVar51 = dVar61 * dVar79 * 0.5;
    dVar59 = dVar66 * dVar83 * 0.5;
    auVar76._0_8_ = dVar61 * dVar79 * 1.5;
    auVar76._8_8_ = dVar66 * dVar83 * 1.5;
    auVar81._0_8_ = dVar79 * 0.5;
    auVar81._8_8_ = dVar83 * 0.5;
    auVar21._0_8_ = ((dVar79 - auVar63._0_8_) - dVar51) * 16384.0;
    auVar21._8_8_ = ((dVar83 - auVar63._8_8_) - dVar59) * 16384.0;
    auVar30 = roundpd(auVar21,auVar21,8);
    auVar84._0_8_ = (dVar79 * -2.5 + 1.0 + auVar76._0_8_) * 16384.0;
    auVar84._8_8_ = (dVar83 * -2.5 + 1.0 + auVar76._8_8_) * 16384.0;
    auVar42 = roundpd(auVar63,auVar84,8);
    auVar44._0_8_ = ((dVar79 + dVar79 + auVar63._0_8_) - auVar76._0_8_) * 16384.0;
    auVar44._8_8_ = ((dVar83 + dVar83 + auVar63._8_8_) - auVar76._8_8_) * 16384.0;
    auVar52 = roundpd(auVar76,auVar44,8);
    auVar54._0_8_ = (dVar51 - auVar81._0_8_) * 16384.0;
    auVar54._8_8_ = (dVar59 - auVar81._8_8_) * 16384.0;
    auVar45._0_4_ = (int)auVar30._0_8_;
    auVar46._4_4_ = (int)auVar30._8_8_;
    auVar46._0_4_ = auVar45._0_4_;
    auVar30 = roundpd(auVar30,auVar54,8);
    auVar46._8_4_ = auVar46._4_4_;
    auVar46._12_4_ = (int)auVar42._8_8_;
    auVar45._8_8_ = auVar46._8_8_;
    auVar45._4_4_ = (int)auVar42._0_8_;
    auVar55._0_4_ = (int)auVar52._0_8_;
    auVar56._4_4_ = (int)auVar52._8_8_;
    auVar56._0_4_ = auVar55._0_4_;
    auVar56._8_4_ = auVar56._4_4_;
    auVar56._12_4_ = (int)auVar30._8_8_;
    auVar55._8_8_ = auVar56._8_8_;
    auVar55._4_4_ = (int)auVar30._0_8_;
    iVar11 = (int)auVar53._0_8_ + x;
    iVar9 = width;
    if (iVar11 < width) {
      iVar9 = iVar11;
    }
    iVar9 = iVar9 + -1;
    iVar8 = (int)auVar53._8_8_ + y;
    iVar7 = height;
    if (iVar8 < height) {
      iVar7 = iVar8;
    }
    auVar30 = packssdw(auVar45,auVar55);
    if (iVar8 < -9) {
      iVar7 = -9;
    }
    if (iVar11 < -9) {
      iVar9 = -10;
    }
    uVar41 = auVar30._0_4_;
    uVar48 = auVar30._4_4_;
    uVar49 = auVar30._8_4_;
    uVar50 = auVar30._12_4_;
    auVar57._4_4_ = uVar41;
    auVar57._0_4_ = uVar41;
    auVar57._8_4_ = uVar41;
    auVar57._12_4_ = uVar41;
    auVar64._4_4_ = uVar49;
    auVar64._0_4_ = uVar49;
    auVar64._8_4_ = uVar49;
    auVar64._12_4_ = uVar49;
    pauVar10 = (undefined1 (*) [16])(ref + ((long)iVar7 + -1) * uVar4 + (long)iVar9);
    lVar6 = 0;
    do {
      auVar30 = *pauVar10;
      auVar42 = pmovzxbw(auVar81,auVar30);
      auVar15._8_4_ = auVar30._8_4_;
      auVar15._12_4_ = auVar30._12_4_;
      auVar15._0_8_ = auVar30._4_8_;
      auVar30 = pmovzxbw(auVar15,auVar15);
      auVar53 = pshufb(auVar42,auVar2);
      auVar42 = pshufb(auVar42,auVar3);
      auVar53 = pmaddwd(auVar53,auVar57);
      auVar42 = pmaddwd(auVar42,auVar64);
      auVar80._0_4_ = auVar42._0_4_ + auVar53._0_4_ + auVar43._0_4_ >> 8;
      auVar80._4_4_ = auVar42._4_4_ + auVar53._4_4_ + auVar43._4_4_ >> 8;
      auVar80._8_4_ = auVar42._8_4_ + auVar53._8_4_ + auVar43._8_4_ >> 8;
      auVar80._12_4_ = auVar42._12_4_ + auVar53._12_4_ + auVar43._12_4_ >> 8;
      auVar53 = pshufb(auVar30,auVar2);
      auVar30 = pshufb(auVar30,auVar3);
      auVar53 = pmaddwd(auVar53,auVar57);
      auVar30 = pmaddwd(auVar30,auVar64);
      auVar16._0_4_ = auVar30._0_4_ + auVar53._0_4_ + auVar43._0_4_ >> 8;
      auVar16._4_4_ = auVar30._4_4_ + auVar53._4_4_ + auVar43._4_4_ >> 8;
      auVar16._8_4_ = auVar30._8_4_ + auVar53._8_4_ + auVar43._8_4_ >> 8;
      auVar16._12_4_ = auVar30._12_4_ + auVar53._12_4_ + auVar43._12_4_ >> 8;
      auVar81 = packssdw(auVar80,auVar16);
      *(undefined1 (*) [16])(auStack_1e8 + lVar6) = auVar81;
      lVar6 = lVar6 + 0x10;
      pauVar10 = (undefined1 (*) [16])(*pauVar10 + uVar4);
    } while (lVar6 != 0xb0);
    auVar58._4_4_ = uVar48;
    auVar58._0_4_ = uVar48;
    auVar58._8_4_ = uVar48;
    auVar58._12_4_ = uVar48;
    auVar65._4_4_ = uVar50;
    auVar65._0_4_ = uVar50;
    auVar65._8_4_ = uVar50;
    auVar65._12_4_ = uVar50;
    lVar6 = 0;
    puVar12 = src + (long)y * uVar4 + (long)x;
    auVar30 = (undefined1  [16])0x0;
    auVar53 = (undefined1  [16])0x0;
    do {
      auVar42 = *(undefined1 (*) [16])(auStack_1e8 + lVar6);
      auVar52 = *(undefined1 (*) [16])(auStack_1c8 + lVar6);
      auVar20._0_12_ = auVar42._0_12_;
      auVar20._12_2_ = auVar42._6_2_;
      auVar20._14_2_ = *(undefined2 *)((long)auStack_1d8 + lVar6 + 6);
      auVar19._12_4_ = auVar20._12_4_;
      auVar19._0_10_ = auVar42._0_10_;
      auVar19._10_2_ = *(undefined2 *)((long)auStack_1d8 + lVar6 + 4);
      auVar18._10_6_ = auVar19._10_6_;
      auVar18._0_8_ = auVar42._0_8_;
      auVar18._8_2_ = auVar42._4_2_;
      auVar17._8_8_ = auVar18._8_8_;
      auVar17._6_2_ = *(undefined2 *)((long)auStack_1d8 + lVar6 + 2);
      auVar17._4_2_ = auVar42._2_2_;
      auVar17._0_2_ = auVar42._0_2_;
      auVar17._2_2_ = *(undefined2 *)((long)auStack_1d8 + lVar6);
      auVar21 = pmaddwd(auVar17,auVar58);
      auVar88._0_12_ = auVar52._0_12_;
      auVar88._12_2_ = auVar52._6_2_;
      auVar88._14_2_ = *(undefined2 *)((long)auStack_1b8 + lVar6 + 6);
      auVar87._12_4_ = auVar88._12_4_;
      auVar87._0_10_ = auVar52._0_10_;
      auVar87._10_2_ = *(undefined2 *)((long)auStack_1b8 + lVar6 + 4);
      auVar86._10_6_ = auVar87._10_6_;
      auVar86._0_8_ = auVar52._0_8_;
      auVar86._8_2_ = auVar52._4_2_;
      auVar85._8_8_ = auVar86._8_8_;
      auVar85._6_2_ = *(undefined2 *)((long)auStack_1b8 + lVar6 + 2);
      auVar85._4_2_ = auVar52._2_2_;
      auVar85._0_2_ = auVar52._0_2_;
      auVar85._2_2_ = *(undefined2 *)((long)auStack_1b8 + lVar6);
      auVar89 = pmaddwd(auVar85,auVar65);
      auVar68._2_2_ = *(undefined2 *)((long)auStack_1d8 + lVar6 + 8);
      auVar68._0_2_ = auVar42._8_2_;
      auVar68._4_2_ = auVar42._10_2_;
      auVar68._6_2_ = *(undefined2 *)((long)auStack_1d8 + lVar6 + 10);
      auVar68._8_2_ = auVar42._12_2_;
      auVar68._10_2_ = *(undefined2 *)((long)auStack_1d8 + lVar6 + 0xc);
      auVar68._12_2_ = auVar42._14_2_;
      auVar68._14_2_ = *(undefined2 *)(auStack_1c8 + lVar6 + -2);
      auVar42 = pmaddwd(auVar68,auVar58);
      auVar77._2_2_ = *(undefined2 *)((long)auStack_1b8 + lVar6 + 8);
      auVar77._0_2_ = auVar52._8_2_;
      auVar77._4_2_ = auVar52._10_2_;
      auVar77._6_2_ = *(undefined2 *)((long)auStack_1b8 + lVar6 + 10);
      auVar77._8_2_ = auVar52._12_2_;
      auVar77._10_2_ = *(undefined2 *)((long)auStack_1b8 + lVar6 + 0xc);
      auVar77._12_2_ = auVar52._14_2_;
      auVar77._14_2_ = *(undefined2 *)((long)auStack_1b8 + lVar6 + 0xe);
      auVar52 = pmaddwd(auVar77,auVar65);
      auVar90._0_4_ = auVar89._0_4_ + auVar21._0_4_ + auVar14._0_4_ >> 0x11;
      auVar90._4_4_ = auVar89._4_4_ + auVar21._4_4_ + auVar14._4_4_ >> 0x11;
      auVar90._8_4_ = auVar89._8_4_ + auVar21._8_4_ + auVar14._8_4_ >> 0x11;
      auVar90._12_4_ = auVar89._12_4_ + auVar21._12_4_ + auVar14._12_4_ >> 0x11;
      auVar78._0_4_ = auVar52._0_4_ + auVar42._0_4_ + auVar14._0_4_ >> 0x11;
      auVar78._4_4_ = auVar52._4_4_ + auVar42._4_4_ + auVar14._4_4_ >> 0x11;
      auVar78._8_4_ = auVar52._8_4_ + auVar42._8_4_ + auVar14._8_4_ >> 0x11;
      auVar78._12_4_ = auVar52._12_4_ + auVar42._12_4_ + auVar14._12_4_ >> 0x11;
      auVar42 = pmovzxbw(auVar21,*(undefined8 *)puVar12);
      auVar52 = packssdw(auVar90,auVar78);
      auVar42 = psllw(auVar42,3);
      auVar91._0_2_ = auVar52._0_2_ - auVar42._0_2_;
      auVar91._2_2_ = auVar52._2_2_ - auVar42._2_2_;
      auVar91._4_2_ = auVar52._4_2_ - auVar42._4_2_;
      auVar91._6_2_ = auVar52._6_2_ - auVar42._6_2_;
      auVar91._8_2_ = auVar52._8_2_ - auVar42._8_2_;
      auVar91._10_2_ = auVar52._10_2_ - auVar42._10_2_;
      auVar91._12_2_ = auVar52._12_2_ - auVar42._12_2_;
      auVar91._14_2_ = auVar52._14_2_ - auVar42._14_2_;
      auVar42 = pmaddwd(*(undefined1 (*) [16])((long)asStack_b8 + lVar6),auVar91);
      auVar47._0_4_ = auVar30._0_4_ + auVar42._0_4_;
      auVar47._4_4_ = auVar30._4_4_ + auVar42._4_4_;
      auVar47._8_4_ = auVar30._8_4_ + auVar42._8_4_;
      auVar47._12_4_ = auVar30._12_4_ + auVar42._12_4_;
      auVar30 = pmaddwd(auVar91,*(undefined1 (*) [16])((long)asStack_138 + lVar6));
      auVar82._0_4_ = auVar53._0_4_ + auVar30._0_4_;
      auVar82._4_4_ = auVar53._4_4_ + auVar30._4_4_;
      auVar82._8_4_ = auVar53._8_4_ + auVar30._8_4_;
      auVar82._12_4_ = auVar53._12_4_ + auVar30._12_4_;
      lVar6 = lVar6 + 0x10;
      puVar12 = puVar12 + uVar4;
      auVar30 = auVar47;
      auVar53 = auVar82;
    } while (lVar6 != 0x80);
    auVar30 = phaddd(auVar47,auVar82);
    auVar30 = phaddd(auVar30,auVar30);
    dVar51 = (double)auVar30._0_4_ * dVar26 * dVar60 +
             (double)auVar30._12_4_ * -(double)auVar33._4_4_ * dVar60;
    dVar59 = (double)auVar30._0_4_ * -(double)auVar33._8_4_ * dVar60 +
             (double)auVar30._12_4_ * dVar32 * dVar60;
    dVar66 = 2.0;
    if (dVar51 <= 2.0) {
      dVar66 = dVar51;
    }
    *u = dVar1 + (double)(-(ulong)(dVar51 < -2.0) & 0xc000000000000000 |
                         ~-(ulong)(dVar51 < -2.0) & (ulong)dVar66);
    dVar66 = 2.0;
    if (dVar59 <= 2.0) {
      dVar66 = dVar59;
    }
    dVar66 = (double)(-(ulong)(dVar59 < -2.0) & 0xc000000000000000 |
                     ~-(ulong)(dVar59 < -2.0) & (ulong)dVar66) + *v;
    *v = dVar66;
  } while ((0.125 <= ABS(dVar51) + ABS(dVar59)) && (iVar5 = iVar5 + 1, iVar5 != 4));
  return;
}

Assistant:

void aom_compute_flow_at_point_sse4_1(const uint8_t *src, const uint8_t *ref,
                                      int x, int y, int width, int height,
                                      int stride, double *u, double *v) {
  DECLARE_ALIGNED(16, double, M[4]);
  DECLARE_ALIGNED(16, double, M_inv[4]);
  DECLARE_ALIGNED(16, int16_t, dx[DISFLOW_PATCH_SIZE * DISFLOW_PATCH_SIZE]);
  DECLARE_ALIGNED(16, int16_t, dy[DISFLOW_PATCH_SIZE * DISFLOW_PATCH_SIZE]);
  int b[2];

  // Compute gradients within this patch
  const uint8_t *src_patch = &src[y * stride + x];
  sobel_filter(src_patch, stride, dx, dy);

  compute_flow_matrix(dx, DISFLOW_PATCH_SIZE, dy, DISFLOW_PATCH_SIZE, M);
  invert_2x2(M, M_inv);

  for (int itr = 0; itr < DISFLOW_MAX_ITR; itr++) {
    compute_flow_vector(src, ref, width, height, stride, x, y, *u, *v, dx, dy,
                        b);

    // Solve flow equations to find a better estimate for the flow vector
    // at this point
    const double step_u = M_inv[0] * b[0] + M_inv[1] * b[1];
    const double step_v = M_inv[2] * b[0] + M_inv[3] * b[1];
    *u += fclamp(step_u * DISFLOW_STEP_SIZE, -2, 2);
    *v += fclamp(step_v * DISFLOW_STEP_SIZE, -2, 2);

    if (fabs(step_u) + fabs(step_v) < DISFLOW_STEP_SIZE_THRESOLD) {
      // Stop iteration when we're close to convergence
      break;
    }
  }
}